

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

size_t duckdb_je_arena_fill_small_fresh
                 (tsdn_t *tsdn,arena_t *arena,szind_t binind,void **ptrs,size_t nfill,_Bool zero)

{
  pthread_mutex_t *__mutex;
  long *plVar1;
  bitmap_t *pbVar2;
  edata_t **ppeVar3;
  void **ptrs_00;
  char cVar4;
  uint uVar5;
  size_t sVar6;
  bitmap_t bVar7;
  uint uVar8;
  int iVar9;
  arena_t *slab;
  uint64_t *puVar10;
  void **ppvVar11;
  bin_t *bin;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  edata_t *slab_00;
  arena_t *arena_00;
  size_t sVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  uint local_98;
  bin_t *local_88;
  mutex_prof_data_t *data;
  
  uVar8 = duckdb_je_manual_arena_base;
  local_98 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    local_98 = (uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                     binshard[binind];
  }
  uVar12 = (ulong)(local_98 << 8);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar12 = (ulong)local_98 * 0x288;
  }
  uVar5 = arena->ind;
  bin = (bin_t *)(ulong)duckdb_je_manual_arena_base;
  slab_00 = (edata_t *)
            ((long)&arena->nthreads[0].repr + uVar12 + duckdb_je_arena_bin_offsets[binind]);
  if (nfill == 0) {
    local_88 = (bin_t *)0x0;
    lVar15 = 0;
    sVar16 = 0;
LAB_00cfeb0f:
    arena_00 = (arena_t *)0x0;
  }
  else {
    uVar12 = (ulong)duckdb_je_bin_infos[binind].nregs;
    sVar6 = duckdb_je_bin_infos[binind].reg_size;
    sVar16 = 0;
    lVar15 = 0;
    local_88 = (bin_t *)0x0;
    do {
      bin = (bin_t *)(ulong)local_98;
      slab = (arena_t *)arena_slab_alloc(tsdn,arena,binind,local_98,duckdb_je_bin_infos + binind);
      if (slab == (arena_t *)0x0) goto LAB_00cfeb0f;
      uVar13 = nfill - sVar16;
      uVar14 = uVar12;
      if (uVar13 < uVar12) {
        uVar14 = uVar13;
      }
      ptrs_00 = ptrs + sVar16;
      ppvVar11 = ptrs_00;
      arena_slab_reg_alloc_batch((edata_t *)slab,duckdb_je_bin_infos + binind,(uint)uVar14,ptrs_00);
      if (zero) {
        switchD_01306cb1::default(*ptrs_00,0,uVar14 * sVar6);
      }
      bVar17 = uVar13 < uVar12;
      arena_00 = slab;
      if (!bVar17) {
        arena_00 = (arena_t *)0x0;
      }
      bin = (bin_t *)CONCAT71((int7)((ulong)ppvVar11 >> 8),bVar17 || uVar5 < uVar8);
      if (!bVar17 && uVar5 >= uVar8) {
        (((anon_union_24_2_895ac29c_for_edata_s_6 *)&(slab->stats).metadata_rtree)->ql_link_active).
        qre_next = (edata_t *)slab;
        (slab->stats).resident = (size_t)slab;
        if (local_88 != (bin_t *)0x0) {
          (((anon_union_24_2_895ac29c_for_edata_s_6 *)&(slab->stats).metadata_rtree)->ql_link_active
          ).qre_next = (edata_t *)(local_88->lock).field_0.field_0.prof_data.prev_owner;
          *(arena_t **)((long)&(local_88->lock).field_0 + 0x30) = slab;
          (slab->stats).resident = *(size_t *)((slab->stats).resident + 0x28);
          (((local_88->lock).field_0.field_0.prof_data.prev_owner)->tsd).
          cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait =
               (uint64_t)local_88;
          *(arena_t **)((slab->stats).resident + 0x28) = slab;
        }
        arena_00 = (arena_t *)0x0;
        bin = local_88;
        local_88 = (bin_t *)(((anon_union_24_2_895ac29c_for_edata_s_6 *)
                             &(slab->stats).metadata_rtree)->ql_link_active).qre_next;
      }
      sVar16 = sVar16 + uVar14;
      lVar15 = lVar15 + 1;
    } while (sVar16 < nfill);
  }
  __mutex = (pthread_mutex_t *)((long)&slab_00->field_6 + 8);
  iVar9 = pthread_mutex_trylock(__mutex);
  if (iVar9 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)slab_00);
    *(undefined1 *)&slab_00->field_6 = 1;
  }
  plVar1 = (long *)((long)&slab_00->field_5 + 0x10);
  *plVar1 = *plVar1 + 1;
  if ((slab_00->field_5).ql_link_active.qre_prev != (edata_t *)tsdn) {
    (slab_00->field_5).ql_link_active.qre_prev = (edata_t *)tsdn;
    (slab_00->field_5).ql_link_active.qre_next =
         (edata_t *)((long)&((slab_00->field_5).ql_link_active.qre_next)->e_bits + 1);
  }
  if (arena_00 != (arena_t *)0x0) {
    arena_bin_lower_slab((tsdn_t *)arena,arena_00,slab_00,bin);
  }
  if (uVar8 <= uVar5) {
    puVar10 = slab_00[1].field_6.e_slab_data.bitmap + 7;
    bVar7 = slab_00[1].field_6.e_slab_data.bitmap[7];
    if (bVar7 != 0) {
      if (local_88 == (bin_t *)0x0) goto LAB_00cfebc2;
      (((local_88->lock).field_0.field_0.prof_data.prev_owner)->tsd).
      cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait =
           *(uint64_t *)(bVar7 + 0x30);
      *(tsdn_t **)(*puVar10 + 0x30) = (local_88->lock).field_0.field_0.prof_data.prev_owner;
      (local_88->lock).field_0.field_0.prof_data.prev_owner =
           (tsdn_t *)
           (((local_88->lock).field_0.field_0.prof_data.prev_owner)->tsd).
           cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait;
      *(uint64_t *)(*(long *)(*puVar10 + 0x30) + 0x28) = *puVar10;
      puVar10 = &(((local_88->lock).field_0.field_0.prof_data.prev_owner)->tsd).
                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait;
    }
    *puVar10 = (uint64_t)local_88;
  }
LAB_00cfebc2:
  slab_00[1].e_sn = slab_00[1].e_sn + lVar15;
  ppeVar3 = &slab_00[1].field_5.ql_link_active.qre_prev;
  *ppeVar3 = (edata_t *)((long)&(*ppeVar3)->e_bits + lVar15);
  pbVar2 = (slab_00->field_6).e_slab_data.bitmap + 6;
  *pbVar2 = *pbVar2 + sVar16;
  auVar18._8_4_ = (int)sVar16;
  auVar18._0_8_ = sVar16;
  auVar18._12_4_ = (int)(sVar16 >> 0x20);
  slab_00[1].e_bits = sVar16 + slab_00[1].e_bits;
  slab_00[1].e_addr = (void *)(auVar18._8_8_ + (long)slab_00[1].e_addr);
  *(undefined1 *)&slab_00->field_6 = 0;
  pthread_mutex_unlock(__mutex);
  if (tsdn != (tsdn_t *)0x0) {
    cVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar9 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar9 + -1;
    if (iVar9 < 1) {
      if (cVar4 < '\x01') {
        uVar12 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar12;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar12 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
      }
      else {
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             0;
      }
    }
  }
  return sVar16;
}

Assistant:

size_t
arena_fill_small_fresh(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    void **ptrs, size_t nfill, bool zero) {
	assert(binind < SC_NBINS);
	const bin_info_t *bin_info = &bin_infos[binind];
	const size_t nregs = bin_info->nregs;
	assert(nregs > 0);
	const size_t usize = bin_info->reg_size;

	const bool manual_arena = !arena_is_auto(arena);
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	size_t nslab = 0;
	size_t filled = 0;
	edata_t *slab = NULL;
	edata_list_active_t fulls;
	edata_list_active_init(&fulls);

	while (filled < nfill && (slab = arena_slab_alloc(tsdn, arena, binind,
	    binshard, bin_info)) != NULL) {
		assert((size_t)edata_nfree_get(slab) == nregs);
		++nslab;
		size_t batch = nfill - filled;
		if (batch > nregs) {
			batch = nregs;
		}
		assert(batch > 0);
		arena_slab_reg_alloc_batch(slab, bin_info, (unsigned)batch,
		    &ptrs[filled]);
		assert(edata_addr_get(slab) == ptrs[filled]);
		if (zero) {
			memset(ptrs[filled], 0, batch * usize);
		}
		filled += batch;
		if (batch == nregs) {
			if (manual_arena) {
				edata_list_active_append(&fulls, slab);
			}
			slab = NULL;
		}
	}

	malloc_mutex_lock(tsdn, &bin->lock);
	/*
	 * Only the last slab can be non-empty, and the last slab is non-empty
	 * iff slab != NULL.
	 */
	if (slab != NULL) {
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}
	if (manual_arena) {
		edata_list_active_concat(&bin->slabs_full, &fulls);
	}
	assert(edata_list_active_empty(&fulls));
	if (config_stats) {
		bin->stats.nslabs += nslab;
		bin->stats.curslabs += nslab;
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += filled;
		bin->stats.curregs += filled;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);

	arena_decay_tick(tsdn, arena);
	return filled;
}